

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O3

void test_archive_string_conversion(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive *paVar4;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  archive *paVar8;
  archive_string_conv *paVar9;
  archive *paVar10;
  archive_string_conv *paVar11;
  archive *sc;
  char *pcVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  wchar_t *wp;
  char *mp;
  char nfd [80];
  char nfc [80];
  archive_mstring mstr;
  archive_entry *ae;
  char utf8_nfc [80];
  char utf8_nfd [80];
  wchar_t wc_nfc [40];
  char utf16le_nfd [80];
  char utf16le_nfc [80];
  char utf16be_nfd [80];
  char utf16be_nfc [80];
  wchar_t wc_nfd [40];
  char buff_1 [512];
  char buff [512];
  wchar_t *local_8e0;
  archive_string local_8d8;
  FILE *local_8b8;
  archive *local_8b0;
  archive_string_conv *local_8a8;
  FILE *local_8a0;
  archive *local_898;
  archive_string_conv *local_890;
  archive *local_888;
  char *local_880;
  char local_878 [79];
  undefined1 local_829;
  char local_828 [79];
  undefined1 local_7d9;
  archive *local_7d8;
  size_t local_7d0;
  archive_mstring local_7c8;
  archive_entry *local_760;
  char local_758 [80];
  char local_708 [80];
  wchar_t local_6b8 [40];
  char local_618 [80];
  char local_5c8 [80];
  char local_578 [80];
  char local_528 [80];
  wchar_t local_4d8 [40];
  char local_438 [512];
  undefined1 local_238 [520];
  
  extract_reference_file("test_archive_string_conversion.txt.Z");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̚',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̛',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_raw(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̜',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_archive_string_conversion.txt.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̞',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile, 512)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_760);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̠',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pFVar5 = fopen("testdata.txt","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̡',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"w\")) != NULL",
                   (void *)0x0);
  sVar6 = archive_read_data(paVar4,local_238,0x200);
  if (0 < (long)sVar6) {
    do {
      fwrite(local_238,1,sVar6,pFVar5);
      sVar6 = archive_read_data(paVar4,local_238,0x200);
    } while (0 < (long)sVar6);
  }
  fclose(pFVar5);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̥',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'č');
    test_skipping(
                 "A test of string normalization for NFC requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8d8.s = (char *)0x0;
    local_8d8.length = 0;
    local_8d8.buffer_length = 0;
    local_7c8.aes_mbs.s = (char *)0x0;
    local_7c8.aes_mbs.length = 0;
    local_7c8.aes_mbs.buffer_length = 0;
    local_7c8.aes_utf8.s = (char *)0x0;
    local_7c8.aes_utf8.length = 0;
    local_7c8.aes_utf8.buffer_length = 0;
    local_7c8.aes_wcs.s = (wchar_t *)0x0;
    local_7c8.aes_wcs.length = 0;
    local_7c8.aes_wcs.buffer_length = 0;
    local_7c8.aes_mbs_in_locale.s = (char *)0x0;
    local_7c8.aes_mbs_in_locale.length = 0;
    local_7c8.aes_mbs_in_locale.buffer_length = 0;
    local_7c8.aes_set = L'\0';
    local_7c8._100_4_ = 0;
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ę',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    local_8a0 = (FILE *)archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ě',(uint)(local_8a0 != (FILE *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    paVar8 = (archive *)archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ĝ',(uint)(paVar8 != (archive *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    paVar9 = archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ğ',(uint)(paVar9 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar10 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ġ',(uint)(paVar10 != (archive *)0x0),"(a2 = archive_write_new()) != NULL",
                     (void *)0x0);
    paVar11 = archive_string_conversion_to_charset(paVar10,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ģ',(uint)(paVar11 != (archive_string_conv *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,paVar4);
    auVar15._0_4_ = -(uint)((int)((ulong)local_8a0 >> 0x20) == 0 && (int)local_8a0 == 0);
    auVar15._4_4_ = -(uint)((int)paVar8 == 0 && (int)((ulong)paVar8 >> 0x20) == 0);
    auVar15._8_4_ = -(uint)((int)((ulong)paVar9 >> 0x20) == 0 && (int)paVar9 == 0);
    auVar15._12_4_ = -(uint)((int)paVar11 == 0 && (int)((ulong)paVar11 >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar15);
    if (iVar1 == 0) {
      local_898 = paVar4;
      local_888 = paVar10;
      archive_string_conversion_set_opt((archive_string_conv *)local_8a0,L'\x02');
      local_8b0 = paVar8;
      archive_string_conversion_set_opt((archive_string_conv *)paVar8,L'\x02');
      local_8a8 = paVar9;
      archive_string_conversion_set_opt(paVar9,L'\x02');
      archive_string_conversion_set_opt(paVar11,L'\x02');
      pFVar5 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'į',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"r\")) != NULL",
                       (void *)0x0);
      local_8b8 = pFVar5;
      pcVar7 = fgets(local_438,0x200,pFVar5);
      local_890 = paVar11;
      if (pcVar7 != (char *)0x0) {
        uVar14 = 1;
        do {
          if (local_438[0] != '#') {
            pcVar7 = strchr(local_438,0x3b);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
              strncpy(local_828,local_438,0x4f);
              local_7d9 = 0;
              pcVar12 = strchr(pcVar7 + 1,10);
              if (pcVar12 != (char *)0x0) {
                *pcVar12 = '\0';
                strncpy(local_878,pcVar7 + 1,0x4f);
                local_829 = 0;
                scan_unicode_pattern(local_758,local_6b8,local_528,local_5c8,local_828,L'\0');
                scan_unicode_pattern(local_708,local_4d8,local_578,local_618,local_878,L'\0');
                sVar6 = strlen(local_708);
                pFVar5 = local_8a0;
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,
                                          (archive_string_conv *)local_8a0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ŧ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_878,local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ū',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_758);
                wVar2 = archive_strncpy_l(&local_8d8,local_758,sVar6,(archive_string_conv *)pFVar5);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ű',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
                failure("NFC(%s) should not be any changed:%d",local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ų',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_758);
                wVar2 = archive_strncpy_l(&local_8d8,local_758,sVar6,local_890);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ź',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfc, t_sconv8)",(void *)0x0);
                failure("NFC(%s) should not be any changed:%d",local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ż',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_578,100000,
                                          (archive_string_conv *)local_8b0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƃ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16be_nfd, 100000, f_sconv16be)",
                                    (void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_878,local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƅ',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_618,100000,local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƌ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16le_nfd, 100000, f_sconv16le)",
                                    (void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_878,local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ǝ',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7c8,local_708,100000,(archive_string_conv *)local_8a0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɲ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfd, 100000, f_sconv8)"
                                    ,(void *)0x0);
                paVar4 = local_898;
                wVar2 = archive_mstring_get_wcs(local_898,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɵ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_878,local_828,
                        uVar14);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ƣ',local_6b8,"wc_nfc",local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7c8,local_578,100000,(archive_string_conv *)local_8b0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƨ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(paVar4,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƪ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_878,local_828,
                        uVar14);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƭ',local_6b8,"wc_nfc",local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7c8,local_618,100000,local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƴ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfd, 100000, f_sconv16le)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(paVar4,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƶ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_878,local_828,
                        uVar14);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ƹ',local_6b8,"wc_nfc",local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_wcs(&local_7c8,local_6b8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƾ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_wcs(&mstr, wc_nfc)",(void *)0x0);
                wVar2 = archive_mstring_get_mbs_l(&local_7c8,&local_880,&local_7d0,local_890);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ǀ',0,"0",(long)wVar2,
                                    "archive_mstring_get_mbs_l( &mstr, &mp, &mplen, t_sconv8)",
                                    (void *)0x0);
                failure("WCS NFC(%s) should be UTF-8 NFC:%d",local_828,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ǃ',local_758,"utf8_nfc",local_880,"mp",(void *)0x0,L'\x01');
              }
            }
          }
          pcVar7 = fgets(local_438,0x200,local_8b8);
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (pcVar7 != (char *)0x0);
      }
      archive_string_free(&local_8d8);
      archive_mstring_clean(&local_7c8);
      fclose(local_8b8);
      iVar1 = archive_read_free(local_898);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'Ǌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free(local_888);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'ǋ';
    }
    else {
      iVar1 = archive_read_free(paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ħ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'Ǡ');
    test_skipping(
                 "A test of string normalization for NFD requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8d8.s = (char *)0x0;
    local_8d8.length = 0;
    local_8d8.buffer_length = 0;
    local_7c8.aes_mbs.s = (char *)0x0;
    local_7c8.aes_mbs.length = 0;
    local_7c8.aes_mbs.buffer_length = 0;
    local_7c8.aes_utf8.s = (char *)0x0;
    local_7c8.aes_utf8.length = 0;
    local_7c8.aes_utf8.buffer_length = 0;
    local_7c8.aes_wcs.s = (wchar_t *)0x0;
    local_7c8.aes_wcs.length = 0;
    local_7c8.aes_wcs.buffer_length = 0;
    local_7c8.aes_mbs_in_locale.s = (char *)0x0;
    local_7c8.aes_mbs_in_locale.length = 0;
    local_7c8.aes_mbs_in_locale.buffer_length = 0;
    local_7c8.aes_set = L'\0';
    local_7c8._100_4_ = 0;
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǭ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    paVar9 = archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǯ',(uint)(paVar9 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    paVar11 = archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǰ',(uint)(paVar11 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    paVar8 = (archive *)archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǲ',(uint)(paVar8 != (archive *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar10 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǳ',(uint)(paVar10 != (archive *)0x0),"(a2 = archive_write_new()) != NULL",
                     (void *)0x0);
    sc = (archive *)archive_string_conversion_to_charset(paVar10,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ǵ',(uint)(sc != (archive *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,paVar4);
    auVar16._0_4_ = -(uint)((int)((ulong)paVar9 >> 0x20) == 0 && (int)paVar9 == 0);
    auVar16._4_4_ = -(uint)((int)paVar11 == 0 && (int)((ulong)paVar11 >> 0x20) == 0);
    auVar16._8_4_ = -(uint)((int)((ulong)paVar8 >> 0x20) == 0 && (int)paVar8 == 0);
    auVar16._12_4_ = -(uint)((int)sc == 0 && (int)((ulong)sc >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar16);
    if (iVar1 == 0) {
      local_8a8 = paVar9;
      local_7d8 = paVar10;
      archive_string_conversion_set_opt(paVar9,L'\x04');
      local_890 = paVar11;
      archive_string_conversion_set_opt(paVar11,L'\x04');
      local_898 = paVar8;
      archive_string_conversion_set_opt((archive_string_conv *)paVar8,L'\x04');
      local_888 = sc;
      archive_string_conversion_set_opt((archive_string_conv *)sc,L'\x04');
      pFVar5 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'Ȃ',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"r\")) != NULL",
                       (void *)0x0);
      local_8a0 = pFVar5;
      pcVar7 = fgets(local_438,0x200,pFVar5);
      local_8b0 = paVar4;
      if (pcVar7 != (char *)0x0) {
        uVar14 = 1;
        do {
          if (local_438[0] != '#') {
            pcVar7 = strchr(local_438,0x3b);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
              strncpy(local_828,local_438,0x4f);
              local_7d9 = 0;
              pcVar12 = strchr(pcVar7 + 1,10);
              if (pcVar12 != (char *)0x0) {
                *pcVar12 = '\0';
                strncpy(local_878,pcVar7 + 1,0x4f);
                local_829 = 0;
                wVar2 = scan_unicode_pattern
                                  (local_758,local_6b8,local_528,local_5c8,local_828,L'\x01');
                scan_unicode_pattern(local_708,local_4d8,local_578,local_618,local_878,L'\0');
                sVar6 = strlen(local_758);
                wVar3 = archive_strncpy_l(&local_8d8,local_758,sVar6,local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ȼ',0,"0",(long)wVar3,
                                    "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
                local_8b8 = (FILE *)CONCAT44(local_8b8._4_4_,wVar2);
                if (wVar2 == L'\0') {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_828,local_878,uVar14);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ƀ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_828,local_878,uVar14
                         );
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ȿ',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                sVar6 = strlen(local_708);
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɋ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
                failure("NFD(%s) should not be any changed:%d",local_878,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɍ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_708);
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,
                                          (archive_string_conv *)local_888);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɓ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, t_sconv8)",(void *)0x0);
                failure("NFD(%s) should not be any changed:%d",local_878,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɖ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_528,100000,local_890);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɜ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16be_nfc, 100000, f_sconv16be)",
                                    (void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_828,local_878,uVar14);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ɤ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_828,local_878,uVar14
                         );
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ɠ',local_758,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                wVar2 = archive_strncpy_l(&local_8d8,local_5c8,100000,
                                          (archive_string_conv *)local_898);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɫ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16le_nfc, 100000, f_sconv16le)",
                                    (void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_828,local_878,uVar14);
                  wVar2 = L'ɳ';
                  pcVar7 = local_708;
                  pcVar12 = "utf8_nfd";
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_828,local_878,uVar14
                         );
                  wVar2 = L'ɯ';
                  pcVar12 = "utf8_nfc";
                  pcVar7 = local_758;
                }
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pcVar7,pcVar12,local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7c8,local_758,100000,local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʃ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfc, 100000, f_sconv8)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8b0,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʅ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-8 NFC(%s) should be converted to WCS NFD(%s):%d",local_828,local_878,
                          uVar14);
                  wVar2 = L'ʍ';
                  pcVar7 = "wc_nfd";
                  pwVar13 = local_4d8;
                }
                else {
                  failure("UTF-8 NFC(%s) should not be converted to WCS NFD(%s):%d",local_828,
                          local_878,uVar14);
                  wVar2 = L'ʉ';
                  pcVar7 = "wc_nfc";
                  pwVar13 = local_6b8;
                }
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pwVar13,pcVar7,local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7c8,local_528,100000,local_890);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʔ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfc, 100000, f_sconv16be)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8b0,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʖ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-16BE NFC(%s) should be converted to WCS NFD(%s):%d",local_828,
                          local_878,uVar14);
                  wVar2 = L'ʟ';
                  pcVar7 = "wc_nfd";
                  pwVar13 = local_4d8;
                }
                else {
                  failure("UTF-16BE NFC(%s) should not be converted to WCS NFD(%s):%d",local_828,
                          local_878,uVar14);
                  wVar2 = L'ʛ';
                  pcVar7 = "wc_nfc";
                  pwVar13 = local_6b8;
                }
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pwVar13,pcVar7,local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7c8,local_5c8,100000,(archive_string_conv *)local_898);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʦ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfc, 100000, f_sconv16le)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8b0,&local_7c8,&local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʨ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-16LE NFC(%s) should be converted to WCS NFD(%s):%d",local_828,
                          local_878,uVar14);
                  wVar2 = L'ʱ';
                  pcVar7 = "wc_nfd";
                  pwVar13 = local_4d8;
                }
                else {
                  failure("UTF-16LE NFC(%s) should not be converted to WCS NFD(%s):%d",local_828,
                          local_878,uVar14);
                  wVar2 = L'ʭ';
                  pcVar7 = "wc_nfc";
                  pwVar13 = local_6b8;
                }
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pwVar13,pcVar7,local_8e0,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_wcs(&local_7c8,local_4d8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʸ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_wcs( &mstr, wc_nfd)",(void *)0x0);
                wVar2 = archive_mstring_get_mbs_l
                                  (&local_7c8,&local_880,&local_7d0,(archive_string_conv *)local_888
                                  );
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʺ',0,"0",(long)wVar2,
                                    "archive_mstring_get_mbs_l( &mstr, &mp, &mplen, t_sconv8)",
                                    (void *)0x0);
                failure("WCS NFD(%s) should be UTF-8 NFD:%d",local_878,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʽ',local_708,"utf8_nfd",local_880,"mp",(void *)0x0,L'\x01');
              }
            }
          }
          pcVar7 = fgets(local_438,0x200,local_8a0);
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (pcVar7 != (char *)0x0);
      }
      archive_string_free(&local_8d8);
      archive_mstring_clean(&local_7c8);
      fclose(local_8a0);
      iVar1 = archive_read_free(local_8b0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'˄',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free(local_7d8);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'˅';
    }
    else {
      iVar1 = archive_read_free(paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'ǹ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  setlocale(6,"en_US.UTF-8");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ː',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˓',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4)
  ;
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˖',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˙',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˜',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"utf8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˟',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˢ',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF-16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˥',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˨',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˫',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˮ',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"utf16be",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˱',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16be\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˴',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF-16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˷',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˺',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"UTF16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˽',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̀',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar9 = archive_string_conversion_to_charset(paVar4,"utf16le",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̃',(uint)(paVar9 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16le\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar9);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̆',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̈',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		fwrite(buff, 1, size, fp);
	fclose(fp);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
}